

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters_dense.h
# Opt level: O2

void __thiscall dense_parameters::set_zero(dense_parameters *this,size_t offset)

{
  uint32_t uVar1;
  weight *pwVar2;
  weight *pwVar3;
  
  uVar1 = this->_stride_shift;
  pwVar2 = this->_begin;
  pwVar3 = pwVar2;
  for (; pwVar2 != pwVar3 + this->_weight_mask + 1; pwVar2 = pwVar2 + (1L << ((byte)uVar1 & 0x3f)))
  {
    pwVar2[offset] = 0.0;
    pwVar3 = this->_begin;
  }
  return;
}

Assistant:

uint32_t stride() const { return 1 << _stride_shift; }